

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last)

{
  string *str;
  ReusableStringStream rss;
  ReusableStringStream RStack_68;
  string local_50;
  
  ReusableStringStream::ReusableStringStream(&RStack_68);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)RStack_68.m_oss,"{ ",2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this != first._M_current)
  {
    StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert(&local_50,(string *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)RStack_68.m_oss,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    str = (string *)(this + 0x20);
    if (str != (string *)first._M_current) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)RStack_68.m_oss,", ",2);
        StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        ::convert(&local_50,str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)RStack_68.m_oss,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        str = str + 1;
      } while (str != (string *)first._M_current);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)RStack_68.m_oss," }",2);
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&RStack_68);
  ReusableStringStream::~ReusableStringStream(&RStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }